

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O3

void hydro_random_buf(void *out,size_t out_len)

{
  uint8_t *puVar1;
  long lVar2;
  undefined8 uVar3;
  ulong uVar4;
  undefined8 *puVar5;
  uchar *dst;
  uchar *src;
  long *in_FS_OFFSET;
  
  hydro_random_ensure_initialized();
  if (out_len < 0x10) {
    uVar4 = 0;
  }
  else {
    lVar2 = *in_FS_OFFSET;
    uVar4 = out_len >> 4;
    puVar1 = (uint8_t *)(lVar2 + -0x40);
    puVar5 = (undefined8 *)out;
    do {
      gimli_core_u8(puVar1,'\0');
      uVar3 = *(undefined8 *)(lVar2 + -0x38);
      *puVar5 = *(undefined8 *)puVar1;
      puVar5[1] = uVar3;
      puVar5 = puVar5 + 2;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
    uVar4 = out_len & 0xfffffffffffffff0;
  }
  lVar2 = *in_FS_OFFSET;
  puVar1 = (uint8_t *)(lVar2 + -0x40);
  if ((out_len & 0xf) != 0) {
    gimli_core_u8(puVar1,'\0');
    memcpy((void *)((long)out + uVar4),puVar1,out_len & 0xf);
  }
  puVar1[0] = '\0';
  puVar1[1] = '\0';
  puVar1[2] = '\0';
  puVar1[3] = '\0';
  puVar1[4] = '\0';
  puVar1[5] = '\0';
  puVar1[6] = '\0';
  puVar1[7] = '\0';
  *(undefined8 *)(lVar2 + -0x38) = 0;
  in_FS_OFFSET[-8] = in_FS_OFFSET[-2];
  in_FS_OFFSET[-2] = in_FS_OFFSET[-2] + 1;
  gimli_core_u8(puVar1,'\0');
  *(undefined1 *)((long)in_FS_OFFSET + -7) = 0x10;
  return;
}

Assistant:

void
hydro_random_buf(void *out, size_t out_len)
{
    uint8_t *p = (uint8_t *) out;
    size_t   i;
    size_t   leftover;

    hydro_random_ensure_initialized();
    for (i = 0; i < out_len / gimli_RATE; i++) {
        gimli_core_u8(hydro_random_context.state, 0);
        memcpy(p + i * gimli_RATE, hydro_random_context.state, gimli_RATE);
    }
    leftover = out_len % gimli_RATE;
    if (leftover != 0) {
        gimli_core_u8(hydro_random_context.state, 0);
        mem_cpy(p + i * gimli_RATE, hydro_random_context.state, leftover);
    }
    hydro_random_ratchet();
}